

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O2

DdNode * Cudd_Disequality(DdManager *dd,int N,int c,DdNode **x,DdNode **y)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  int iVar7;
  DdNode *pDVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  DdNode *g;
  DdNode *pDVar15;
  int iVar16;
  DdNode *n;
  int iVar17;
  int iVar18;
  DdNode *n_00;
  int iVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  int local_12c;
  int local_128;
  int local_120;
  DdNode *local_118;
  DdNode *local_110;
  DdNode *local_108;
  
  pDVar15 = dd->one;
  pDVar8 = (DdNode *)((ulong)pDVar15 ^ 1);
  iVar14 = 1 << ((byte)N - 1 & 0x1f);
  if (N < 0) {
LAB_0065f52d:
    pDVar15 = (DdNode *)0x0;
  }
  else if (N == 0) {
    if (c == 0) {
      pDVar15 = pDVar8;
    }
  }
  else {
    iVar3 = 1 << ((byte)N & 0x1f);
    if (1 - iVar3 <= c && c < iVar3) {
      local_110 = (DdNode *)0x0;
      local_118 = (DdNode *)0x0;
      local_108 = (DdNode *)0x0;
      uVar10 = 1;
      iVar3 = c + -1;
      iVar20 = c + 1;
      local_12c = iVar14;
      local_128 = iVar14;
      for (uVar21 = 1; uVar21 != N + 1; uVar21 = uVar21 + 1) {
        iVar19 = (c + -1 >> ((byte)uVar21 & 0x1f)) + 2;
        iVar17 = c + 1 >> ((byte)uVar21 & 0x1f);
        uVar2 = (uint)((uVar10 & c + 2U) != 1);
        lVar9 = (uint)N - uVar21;
        iVar16 = 1 << ((byte)lVar9 & 0x1f);
        uVar10 = uVar10 * 2 + 1;
        iVar13 = iVar17 * 2;
        iVar18 = local_128 + uVar2 * -2;
        iVar7 = c + uVar2 * -2;
        iVar22 = local_12c + uVar2 * -2;
        n = (DdNode *)0x0;
        n_00 = (DdNode *)0x0;
        local_120 = iVar14;
        iVar12 = iVar14;
        for (iVar11 = iVar17 + uVar2 + -1; iVar11 < iVar19; iVar11 = iVar11 + 1) {
          pDVar6 = n_00;
          iVar4 = local_120;
          if ((iVar11 < iVar16) && (-iVar16 < iVar11)) {
            iVar4 = uVar2 * 2 + iVar13 + -2;
            pDVar6 = pDVar15;
            if (((iVar4 <= iVar20) && (iVar3 < (int)(uVar2 * 2 + -3 + iVar13))) &&
               ((uVar21 != 1 || (pDVar6 = pDVar8, iVar7 + 3 != iVar13)))) {
              if ((iVar22 + 3 != iVar13) && (iVar18 + 3 != iVar13)) {
                __assert_fail("leftChild == index[0] || leftChild == index[1]",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/cudd/cuddPriority.c"
                              ,0x3ed,
                              "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                             );
              }
              pDVar6 = local_110;
              if (iVar22 + 3 == iVar13) {
                pDVar6 = local_118;
              }
            }
            g = pDVar15;
            if (((iVar4 < iVar20) && (iVar3 < iVar4)) &&
               ((uVar21 != 1 || (g = pDVar8, iVar7 + 2 != iVar13)))) {
              if ((iVar22 + 2 != iVar13) && (iVar18 + 2 != iVar13)) {
                __assert_fail("middleChild == index[0] || middleChild == index[1]",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/cudd/cuddPriority.c"
                              ,0x3fc,
                              "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                             );
              }
              g = local_110;
              if (iVar22 + 2 == iVar13) {
                g = local_118;
              }
            }
            pDVar5 = pDVar15;
            if ((((int)(uVar2 * 2 + -1 + iVar13) < iVar20) && (iVar3 <= iVar4)) &&
               ((uVar21 != 1 || (pDVar5 = pDVar8, iVar7 + 1 != iVar13)))) {
              if ((iVar22 + 1 != iVar13) && (iVar18 + 1 != iVar13)) {
                __assert_fail("rightChild == index[0] || rightChild == index[1]",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/cudd/cuddPriority.c"
                              ,0x40b,
                              "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                             );
              }
              pDVar5 = local_110;
              if (iVar22 + 1 == iVar13) {
                pDVar5 = local_118;
              }
            }
            pDVar5 = Cudd_bddIte(dd,y[lVar9],g,pDVar5);
            if (pDVar5 != (DdNode *)0x0) {
              piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              pDVar6 = Cudd_bddIte(dd,y[lVar9],pDVar6,g);
              if (pDVar6 != (DdNode *)0x0) {
                piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                local_108 = Cudd_bddIte(dd,x[lVar9],pDVar5,pDVar6);
                if (local_108 != (DdNode *)0x0) {
                  piVar1 = (int *)(((ulong)local_108 & 0xfffffffffffffffe) + 4);
                  *piVar1 = *piVar1 + 1;
                  Cudd_IterDerefBdd(dd,pDVar5);
                  Cudd_IterDerefBdd(dd,pDVar6);
                  if (iVar12 != iVar14 && local_120 != iVar14) {
                    __assert_fail("newIndex[0] == invalidIndex || newIndex[1] == invalidIndex",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/cudd/cuddPriority.c"
                                  ,0x436,
                                  "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                                 );
                  }
                  pDVar6 = local_108;
                  iVar4 = iVar11;
                  if (local_120 != iVar14) {
                    n = local_108;
                    pDVar6 = n_00;
                    iVar4 = local_120;
                    iVar12 = iVar11;
                  }
                  goto LAB_0065f3f5;
                }
                Cudd_IterDerefBdd(dd,pDVar5);
                pDVar5 = pDVar6;
              }
              Cudd_IterDerefBdd(dd,pDVar5);
            }
            if (local_12c != iVar14) {
              Cudd_IterDerefBdd(dd,local_118);
            }
            if (local_128 != iVar14) {
              Cudd_IterDerefBdd(dd,local_110);
            }
            if (local_120 != iVar14) {
              Cudd_IterDerefBdd(dd,n_00);
            }
            if (iVar12 != iVar14) {
              Cudd_IterDerefBdd(dd,n);
            }
            goto LAB_0065f52d;
          }
LAB_0065f3f5:
          local_120 = iVar4;
          iVar13 = iVar13 + 2;
          n_00 = pDVar6;
        }
        if (local_12c != iVar14) {
          Cudd_IterDerefBdd(dd,local_118);
        }
        if (local_128 != iVar14) {
          Cudd_IterDerefBdd(dd,local_110);
        }
        local_12c = local_120;
        iVar3 = iVar17 + uVar2 + -2;
        iVar20 = iVar19;
        local_128 = iVar12;
        local_118 = n_00;
        local_110 = n;
      }
      piVar1 = (int *)(((ulong)local_108 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      pDVar15 = local_108;
    }
  }
  return pDVar15;
}

Assistant:

DdNode *
Cudd_Disequality(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  int c /* right-hand side constant */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    /* The nodes at level i represent values of the difference that are
    ** multiples of 2^i.  We use variables with names starting with k
    ** to denote the multipliers of 2^i in such multiples. */
    int kTrueLb = c + 1;
    int kTrueUb = c - 1;
    int kFalse = c;
    /* Mask used to compute the ceiling function.  Since we divide by 2^i,
    ** we want to know whether the dividend is a multiple of 2^i.  If it is,
    ** then ceiling and floor coincide; otherwise, they differ by one. */
    int mask = 1;
    int i;

    DdNode *f = NULL;           /* the eventual result */
    DdNode *one = DD_ONE(dd);
    DdNode *zero = Cudd_Not(one);

    /* Two x-labeled nodes are created at most at each iteration.  They are
    ** stored, along with their k values, in these variables.  At each level,
    ** the old nodes are freed and the new nodes are copied into the old map.
    */
    DdNode *map[2] = {0};
    int invalidIndex = 1 << (N-1);
    int index[2] = {invalidIndex, invalidIndex};

    /* This should never happen. */
    if (N < 0) return(NULL);

    /* If there are no bits, both operands are 0.  The result depends on c. */
    if (N == 0) {
        if (c != 0) return(one);
        else return(zero);
    }

    /* The maximum or the minimum difference comparing to c can generate the terminal case */
    if ((1 << N) - 1 < c || (-(1 << N) + 1) > c) return(one);

    /* Build the result bottom up. */
    for (i = 1; i <= N; i++) {
        int kTrueLbLower, kTrueUbLower;
        int leftChild, middleChild, rightChild;
        DdNode *g0, *g1, *fplus, *fequal, *fminus;
        int j;
        DdNode *newMap[2] = {NULL};
        int newIndex[2];

        kTrueLbLower = kTrueLb;
        kTrueUbLower = kTrueUb;
        /* kTrueLb = floor((c-1)/2^i) + 2 */
        kTrueLb = ((c-1) >> i) + 2;
        /* kTrueUb = ceiling((c+1)/2^i) - 2 */
        kTrueUb = ((c+1) >> i) + (((c+2) & mask) != 1) - 2;
        mask = (mask << 1) | 1;
        newIndex[0] = invalidIndex;
        newIndex[1] = invalidIndex;

        for (j = kTrueUb + 1; j < kTrueLb; j++) {
            /* Skip if node is not reachable from top of BDD. */
            if ((j >= (1 << (N - i))) || (j <= -(1 << (N -i)))) continue;

            /* Find f- */
            leftChild = (j << 1) - 1;
            if (leftChild >= kTrueLbLower || leftChild <= kTrueUbLower) {
                fminus = one;
            } else if (i == 1 && leftChild == kFalse) {
                fminus = zero;
            } else {
                assert(leftChild == index[0] || leftChild == index[1]);
                if (leftChild == index[0]) {
                    fminus = map[0];
                } else {
                    fminus = map[1];
                }
            }

            /* Find f= */
            middleChild = j << 1;
            if (middleChild >= kTrueLbLower || middleChild <= kTrueUbLower) {
                fequal = one;
            } else if (i == 1 && middleChild == kFalse) {
                fequal = zero;
            } else {
                assert(middleChild == index[0] || middleChild == index[1]);
                if (middleChild == index[0]) {
                    fequal = map[0];
                } else {
                    fequal = map[1];
                }
            }

            /* Find f+ */
            rightChild = (j << 1) + 1;
            if (rightChild >= kTrueLbLower || rightChild <= kTrueUbLower) {
                fplus = one;
            } else if (i == 1 && rightChild == kFalse) {
                fplus = zero;
            } else {
                assert(rightChild == index[0] || rightChild == index[1]);
                if (rightChild == index[0]) {
                    fplus = map[0];
                } else {
                    fplus = map[1];
                }
            }

            /* Build new nodes. */
            g1 = Cudd_bddIte(dd, y[N - i], fequal, fplus);
            if (g1 == NULL) {
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g1);
            g0 = Cudd_bddIte(dd, y[N - i], fminus, fequal);
            if (g0 == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g0);
            f = Cudd_bddIte(dd, x[N - i], g1, g0);
            if (f == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                Cudd_IterDerefBdd(dd, g0);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(f);
            Cudd_IterDerefBdd(dd, g1);
            Cudd_IterDerefBdd(dd, g0);

            /* Save newly computed node in map. */
            assert(newIndex[0] == invalidIndex || newIndex[1] == invalidIndex);
            if (newIndex[0] == invalidIndex) {
                newIndex[0] = j;
                newMap[0] = f;
            } else {
                newIndex[1] = j;
                newMap[1] = f;
            }
        }

        /* Copy new map to map. */
        if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
        if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
        map[0] = newMap[0];
        map[1] = newMap[1];
        index[0] = newIndex[0];
        index[1] = newIndex[1];
    }

    cuddDeref(f);
    return(f);

}